

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall
QHeaderView::paintSection(QHeaderView *this,QPainter *painter,QRect *rect,int logicalIndex)

{
  char cVar1;
  undefined8 uVar2;
  QBrush *pQVar3;
  QStyle *pQVar4;
  ColorGroup CVar5;
  long in_FS_OFFSET;
  QBrush nBrushWindow;
  QBrush nBrushButton;
  QBrush oBrushWindow;
  QBrush oBrushButton;
  QStyleOptionHeaderV2 opt;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  double local_e8;
  double dStack_e0;
  undefined1 local_d8 [16];
  QStyleOptionHeaderV2 local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x2).m_i < (rect->x1).m_i) || ((rect->y2).m_i < (rect->y1).m_i)) goto LAB_0055b87c;
  memset(&local_c0,0xaa,0x88);
  QStyleOptionHeaderV2::QStyleOptionHeaderV2(&local_c0);
  local_e8 = -NAN;
  dStack_e0 = -NAN;
  uVar2 = QPainter::brushOrigin();
  local_e8 = (double)(int)uVar2;
  dStack_e0 = (double)(int)((ulong)uVar2 >> 0x20);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x318))(this,&local_c0);
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  CVar5 = (int)&local_c0 + 0x28;
  pQVar3 = (QBrush *)QPalette::brush(CVar5,Dark);
  QBrush::QBrush((QBrush *)&local_f0,pQVar3);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QBrush *)QPalette::brush(CVar5,Dark);
  QBrush::QBrush((QBrush *)&local_f8,pQVar3);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x310))(this,&local_c0,logicalIndex);
  local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
  local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
  local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
  local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
  local_100 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QBrush *)QPalette::brush(CVar5,Dark);
  QBrush::QBrush((QBrush *)&local_100,pQVar3);
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QBrush *)QPalette::brush(CVar5,Dark);
  QBrush::QBrush((QBrush *)&local_108,pQVar3);
  cVar1 = QBrush::operator==((QBrush *)&local_f0,(QBrush *)&local_100);
  if (cVar1 == '\0') {
LAB_0055b7cd:
    local_d8._8_4_ =
         SUB84((double)local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.y1.m_i,0);
    local_d8._0_8_ = (double)local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.x1.m_i;
    local_d8._12_4_ =
         (int)((ulong)(double)local_c0.super_QStyleOptionHeader.super_QStyleOption.rect.y1.m_i >>
              0x20);
    QPainter::setBrushOrigin((QPointF *)painter);
  }
  else {
    cVar1 = QBrush::operator==((QBrush *)&local_f8,(QBrush *)&local_108);
    if (cVar1 == '\0') goto LAB_0055b7cd;
  }
  pQVar4 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar4 + 0xb8))(pQVar4,0x17,&local_c0,painter,this);
  QPainter::setBrushOrigin((QPointF *)painter);
  QBrush::~QBrush((QBrush *)&local_108);
  QBrush::~QBrush((QBrush *)&local_100);
  QBrush::~QBrush((QBrush *)&local_f8);
  QBrush::~QBrush((QBrush *)&local_f0);
  QIcon::~QIcon(&local_c0.super_QStyleOptionHeader.icon);
  if (&(local_c0.super_QStyleOptionHeader.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.super_QStyleOptionHeader.text.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_c0.super_QStyleOptionHeader.text.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.super_QStyleOptionHeader.text.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.super_QStyleOptionHeader.text.d.d)->super_QArrayData,2,0x10)
      ;
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
LAB_0055b87c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::paintSection(QPainter *painter, const QRect &rect, int logicalIndex) const
{
    if (!rect.isValid())
        return;

    QStyleOptionHeaderV2 opt;
    QPointF oldBO = painter->brushOrigin();

    initStyleOption(&opt);

    QBrush oBrushButton = opt.palette.brush(QPalette::Button);
    QBrush oBrushWindow = opt.palette.brush(QPalette::Window);

    initStyleOptionForIndex(&opt, logicalIndex);
    // We set rect here. If it needs to be changed it can be changed by overriding this function
    opt.rect = rect;

    QBrush nBrushButton = opt.palette.brush(QPalette::Button);
    QBrush nBrushWindow = opt.palette.brush(QPalette::Window);

    // If relevant brushes are not the same as from the regular widgets we set the brush origin
    if (oBrushButton != nBrushButton || oBrushWindow != nBrushWindow) {
        painter->setBrushOrigin(opt.rect.topLeft());
    }

    // draw the section.
    style()->drawControl(QStyle::CE_Header, &opt, painter, this);
    painter->setBrushOrigin(oldBO);
}